

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O0

void MARGINAL::save_load(data *sm,io_buf *io,bool read,bool text)

{
  float fVar1;
  byte bVar2;
  uint32_t uVar3;
  size_t sVar4;
  ostream *poVar5;
  pointer ppVar6;
  pointer ppVar7;
  byte in_CL;
  byte bVar8;
  uint uVar9;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long,_pair<expert,_expert>_>_&&>::value,_pair<iterator,_bool>_>
  _Var10;
  expert e2;
  expert e1;
  float w2;
  float c2;
  float r2;
  float w1;
  float c1;
  float r1;
  uint64_t index_1;
  size_t i_1;
  iterator exp_iter;
  double denominator;
  double numerator;
  uint64_t index;
  size_t i;
  iterator iter;
  uint64_t total_size;
  stringstream msg;
  uint64_t stride_shift;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  expert *in_stack_fffffffffffffc80;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_false>
  in_stack_fffffffffffffc90;
  long in_stack_fffffffffffffc98;
  ostream *in_stack_fffffffffffffca0;
  ostream *in_stack_fffffffffffffca8;
  ostream *in_stack_fffffffffffffcb0;
  io_buf *in_stack_fffffffffffffcb8;
  float local_258;
  float local_254;
  float local_250;
  float local_24c;
  float local_248;
  ulong local_238;
  ulong local_1d0;
  ulong local_1b0;
  stringstream local_1a8 [15];
  undefined1 in_stack_fffffffffffffe67;
  stringstream *in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe77;
  char *in_stack_fffffffffffffe78;
  size_t in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  io_buf *in_stack_fffffffffffffe90;
  byte local_20;
  
  bVar8 = in_DL & 1;
  bVar2 = in_CL & 1;
  uVar3 = parameters::stride_shift
                    ((parameters *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  sVar4 = v_array<int>::size((v_array<int> *)(in_RSI + 0x30));
  if (sVar4 != 0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    if (bVar8 == 0) {
      local_1b0 = std::
                  unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
                  ::size((unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
                          *)0x37404e);
      poVar5 = std::operator<<((ostream *)&stack0xfffffffffffffe68,"marginals size = ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1b0);
      std::operator<<(poVar5,"\n");
    }
    uVar9 = (uint)bVar2;
    bin_text_read_write_fixed_validated
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe78,(bool)in_stack_fffffffffffffe77,in_stack_fffffffffffffe68,
               (bool)in_stack_fffffffffffffe67);
    std::
    unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
    ::begin((unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffc7c,uVar9));
    for (local_1d0 = 0; local_20 = (byte)uVar3, local_1d0 < local_1b0; local_1d0 = local_1d0 + 1) {
      if (bVar8 == 0) {
        ppVar6 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_long,_std::pair<double,_double>_>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::pair<double,_double>_>,_false,_false>
                               *)0x37416e);
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           (&stack0xfffffffffffffe68,ppVar6->first >> (local_20 & 0x3f));
        std::operator<<(poVar5,":");
      }
      bin_text_read_write_fixed
                (in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
                 (size_t)in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0,
                 SUB81((ulong)in_stack_fffffffffffffc98 >> 0x38,0),
                 (stringstream *)in_stack_fffffffffffffc90._M_cur,(bool)in_stack_fffffffffffffc8f);
      if (bVar8 == 0) {
        ppVar6 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_long,_std::pair<double,_double>_>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::pair<double,_double>_>,_false,_false>
                               *)0x374219);
        poVar5 = (ostream *)
                 std::ostream::operator<<(&stack0xfffffffffffffe68,(ppVar6->second).first);
        std::operator<<(poVar5,":");
      }
      bin_text_read_write_fixed
                (in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
                 (size_t)in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0,
                 SUB81((ulong)in_stack_fffffffffffffc98 >> 0x38,0),
                 (stringstream *)in_stack_fffffffffffffc90._M_cur,(bool)in_stack_fffffffffffffc8f);
      if (bVar8 == 0) {
        ppVar6 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_long,_std::pair<double,_double>_>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::pair<double,_double>_>,_false,_false>
                               *)0x3742be);
        poVar5 = (ostream *)
                 std::ostream::operator<<(&stack0xfffffffffffffe68,(ppVar6->second).second);
        std::operator<<(poVar5,"\n");
      }
      uVar9 = (uint)bVar2;
      bin_text_read_write_fixed
                (in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
                 (size_t)in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0,
                 SUB81((ulong)in_stack_fffffffffffffc98 >> 0x38,0),
                 (stringstream *)in_stack_fffffffffffffc90._M_cur,(bool)in_stack_fffffffffffffc8f);
      if (bVar8 == 0) {
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_long,_std::pair<double,_double>_>,_false,_false>::
        operator++((_Node_iterator<std::pair<const_unsigned_long,_std::pair<double,_double>_>,_false,_false>
                    *)in_stack_fffffffffffffc80);
      }
      else {
        std::make_pair<double&,double&>
                  ((double *)in_stack_fffffffffffffc80,
                   (double *)CONCAT44(in_stack_fffffffffffffc7c,uVar9));
        std::make_pair<unsigned_long,std::pair<double,double>>
                  ((unsigned_long *)in_stack_fffffffffffffc80,
                   (pair<double,_double> *)CONCAT44(in_stack_fffffffffffffc7c,uVar9));
        std::
        unordered_map<unsigned_long,std::pair<double,double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>>
        ::insert<std::pair<unsigned_long,std::pair<double,double>>>
                  ((unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
                    *)in_stack_fffffffffffffc90._M_cur,
                   (pair<unsigned_long,_std::pair<double,_double>_> *)
                   CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
      }
    }
    if ((*(byte *)(in_RDI + 0x6948) & 1) != 0) {
      if (bVar8 == 0) {
        local_1b0 = std::
                    unordered_map<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>_>
                    ::size((unordered_map<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>_>
                            *)0x374491);
        poVar5 = std::operator<<((ostream *)&stack0xfffffffffffffe68,"expert_state size = ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1b0);
        std::operator<<(poVar5,"\n");
      }
      uVar9 = (uint)bVar2;
      bin_text_read_write_fixed_validated
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 in_stack_fffffffffffffe78,(bool)in_stack_fffffffffffffe77,in_stack_fffffffffffffe68
                 ,(bool)in_stack_fffffffffffffe67);
      std::
      unordered_map<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>_>
      ::begin((unordered_map<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffc7c,uVar9));
      for (local_238 = 0; local_238 < local_1b0; local_238 = local_238 + 1) {
        if (bVar8 == 0) {
          ppVar7 = std::__detail::
                   _Node_iterator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_false,_false>
                                 *)0x37457f);
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             (&stack0xfffffffffffffe68,ppVar7->first >> (local_20 & 0x3f));
          std::operator<<(poVar5,":");
        }
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
                   (size_t)in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0,
                   SUB81((ulong)in_stack_fffffffffffffc98 >> 0x38,0),
                   (stringstream *)in_stack_fffffffffffffc90._M_cur,(bool)in_stack_fffffffffffffc8f)
        ;
        if (bVar8 == 0) {
          ppVar7 = std::__detail::
                   _Node_iterator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_false,_false>
                                 *)0x37462d);
          fVar1 = (ppVar7->second).first.regret;
          ppVar7 = std::__detail::
                   _Node_iterator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_false,_false>
                                 *)0x374645);
          local_248 = (ppVar7->second).first.abs_regret;
          ppVar7 = std::__detail::
                   _Node_iterator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_false,_false>
                                 *)0x37465d);
          local_24c = (ppVar7->second).first.weight;
          ppVar7 = std::__detail::
                   _Node_iterator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_false,_false>
                                 *)0x374675);
          local_250 = (ppVar7->second).second.regret;
          ppVar7 = std::__detail::
                   _Node_iterator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_false,_false>
                                 *)0x37468d);
          local_254 = (ppVar7->second).second.abs_regret;
          ppVar7 = std::__detail::
                   _Node_iterator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_false,_false>
                                 *)0x3746a5);
          local_258 = (ppVar7->second).second.weight;
          poVar5 = (ostream *)std::ostream::operator<<(&stack0xfffffffffffffe68,fVar1);
          std::operator<<(poVar5,":");
        }
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
                   (size_t)in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0,
                   SUB81((ulong)in_stack_fffffffffffffc98 >> 0x38,0),
                   (stringstream *)in_stack_fffffffffffffc90._M_cur,(bool)in_stack_fffffffffffffc8f)
        ;
        if (bVar8 == 0) {
          poVar5 = (ostream *)std::ostream::operator<<(&stack0xfffffffffffffe68,local_248);
          std::operator<<(poVar5,":");
        }
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
                   (size_t)in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0,
                   SUB81((ulong)in_stack_fffffffffffffc98 >> 0x38,0),
                   (stringstream *)in_stack_fffffffffffffc90._M_cur,(bool)in_stack_fffffffffffffc8f)
        ;
        if (bVar8 == 0) {
          in_stack_fffffffffffffcb8 =
               (io_buf *)std::ostream::operator<<(&stack0xfffffffffffffe68,local_24c);
          std::operator<<((ostream *)in_stack_fffffffffffffcb8,":");
        }
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
                   (size_t)in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0,
                   SUB81((ulong)in_stack_fffffffffffffc98 >> 0x38,0),
                   (stringstream *)in_stack_fffffffffffffc90._M_cur,(bool)in_stack_fffffffffffffc8f)
        ;
        if (bVar8 == 0) {
          in_stack_fffffffffffffcb0 =
               (ostream *)std::ostream::operator<<(&stack0xfffffffffffffe68,local_250);
          std::operator<<(in_stack_fffffffffffffcb0,":");
        }
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
                   (size_t)in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0,
                   SUB81((ulong)in_stack_fffffffffffffc98 >> 0x38,0),
                   (stringstream *)in_stack_fffffffffffffc90._M_cur,(bool)in_stack_fffffffffffffc8f)
        ;
        if (bVar8 == 0) {
          in_stack_fffffffffffffca8 =
               (ostream *)std::ostream::operator<<(&stack0xfffffffffffffe68,local_254);
          std::operator<<(in_stack_fffffffffffffca8,":");
        }
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
                   (size_t)in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0,
                   SUB81((ulong)in_stack_fffffffffffffc98 >> 0x38,0),
                   (stringstream *)in_stack_fffffffffffffc90._M_cur,(bool)in_stack_fffffffffffffc8f)
        ;
        if (bVar8 == 0) {
          in_stack_fffffffffffffca0 =
               (ostream *)std::ostream::operator<<(&stack0xfffffffffffffe68,local_258);
          std::operator<<(in_stack_fffffffffffffca0,":");
        }
        uVar9 = (uint)bVar2;
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
                   (size_t)in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0,
                   SUB81((ulong)in_stack_fffffffffffffc98 >> 0x38,0),
                   (stringstream *)in_stack_fffffffffffffc90._M_cur,(bool)in_stack_fffffffffffffc8f)
        ;
        if (bVar8 == 0) {
          std::__detail::
          _Node_iterator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_false,_false>
          ::operator++((_Node_iterator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_false,_false>
                        *)in_stack_fffffffffffffc80);
        }
        else {
          in_stack_fffffffffffffc98 = in_RDI + 0x6960;
          std::make_pair<MARGINAL::expert&,MARGINAL::expert&>
                    (in_stack_fffffffffffffc80,(expert *)CONCAT44(in_stack_fffffffffffffc7c,uVar9));
          std::make_pair<unsigned_long,std::pair<MARGINAL::expert,MARGINAL::expert>>
                    ((unsigned_long *)in_stack_fffffffffffffc80,
                     (pair<MARGINAL::expert,_MARGINAL::expert> *)
                     CONCAT44(in_stack_fffffffffffffc7c,uVar9));
          _Var10 = std::
                   unordered_map<unsigned_long,std::pair<MARGINAL::expert,MARGINAL::expert>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>>
                   ::insert<std::pair<unsigned_long,std::pair<MARGINAL::expert,MARGINAL::expert>>>
                             ((unordered_map<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>_>
                               *)in_stack_fffffffffffffc90._M_cur,
                              (pair<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_> *
                              )CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
          in_stack_fffffffffffffc90._M_cur =
               (__node_type *)
               _Var10.first.
               super__Node_iterator_base<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_false>
               ._M_cur;
          in_stack_fffffffffffffc8f = _Var10.second;
        }
      }
    }
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  return;
}

Assistant:

void save_load(data& sm, io_buf& io, bool read, bool text)
{
  uint64_t stride_shift = sm.all->weights.stride_shift();

  if (io.files.size() == 0)
    return;
  stringstream msg;
  uint64_t total_size;
  if (!read)
  {
    total_size = (uint64_t)sm.marginals.size();
    msg << "marginals size = " << total_size << "\n";
  }
  bin_text_read_write_fixed_validated(io, (char*)&total_size, sizeof(total_size), "", read, msg, text);

  auto iter = sm.marginals.begin();
  for (size_t i = 0; i < total_size; ++i)
  {
    uint64_t index;
    if (!read)
    {
      index = iter->first >> stride_shift;
      msg << index << ":";
    }
    bin_text_read_write_fixed(io, (char*)&index, sizeof(index), "", read, msg, text);
    double numerator;
    if (!read)
    {
      numerator = iter->second.first;
      msg << numerator << ":";
    }
    bin_text_read_write_fixed(io, (char*)&numerator, sizeof(numerator), "", read, msg, text);
    double denominator;
    if (!read)
    {
      denominator = iter->second.second;
      msg << denominator << "\n";
    }
    bin_text_read_write_fixed(io, (char*)&denominator, sizeof(denominator), "", read, msg, text);
    if (read)
      sm.marginals.insert(make_pair(index << stride_shift, make_pair(numerator, denominator)));
    else
      ++iter;
  }

  if (sm.compete)
  {
    if (!read)
    {
      total_size = (uint64_t)sm.expert_state.size();
      msg << "expert_state size = " << total_size << "\n";
    }
    bin_text_read_write_fixed_validated(io, (char*)&total_size, sizeof(total_size), "", read, msg, text);

    auto exp_iter = sm.expert_state.begin();
    for (size_t i = 0; i < total_size; ++i)
    {
      uint64_t index;
      if (!read)
      {
        index = exp_iter->first >> stride_shift;
        msg << index << ":";
      }
      bin_text_read_write_fixed(io, (char*)&index, sizeof(index), "", read, msg, text);
      float r1, c1, w1, r2, c2, w2;
      if (!read)
      {
        r1 = exp_iter->second.first.regret;
        c1 = exp_iter->second.first.abs_regret;
        w1 = exp_iter->second.first.weight;
        r2 = exp_iter->second.second.regret;
        c2 = exp_iter->second.second.abs_regret;
        w2 = exp_iter->second.second.weight;
        msg << r1 << ":";
      }
      bin_text_read_write_fixed(io, (char*)&r1, sizeof(r1), "", read, msg, text);
      if (!read)
        msg << c1 << ":";
      bin_text_read_write_fixed(io, (char*)&c1, sizeof(c1), "", read, msg, text);
      if (!read)
        msg << w1 << ":";
      bin_text_read_write_fixed(io, (char*)&w1, sizeof(w1), "", read, msg, text);
      if (!read)
        msg << r2 << ":";
      bin_text_read_write_fixed(io, (char*)&r2, sizeof(r2), "", read, msg, text);
      if (!read)
        msg << c2 << ":";
      bin_text_read_write_fixed(io, (char*)&c2, sizeof(c2), "", read, msg, text);
      if (!read)
        msg << w2 << ":";
      bin_text_read_write_fixed(io, (char*)&w2, sizeof(w2), "", read, msg, text);

      if (read)
      {
        expert e1 = {r1, c1, w1};
        expert e2 = {r2, c2, w2};
        sm.expert_state.insert(make_pair(index << stride_shift, make_pair(e1, e2)));
      }
      else
        ++exp_iter;
    }
  }
}